

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O0

void test_ibuf_consume_before(void)

{
  char *pcVar1;
  size_t sVar2;
  char *pos;
  ibuf ibuf;
  
  plan(4);
  _space(_stdout);
  printf("# *** %s ***\n","test_ibuf_consume_before");
  ibuf_create((ibuf *)&pos,&cache,0x400);
  ibuf_alloc((ibuf *)&pos,5000);
  pcVar1 = ibuf.rpos;
  ibuf_consume_before((ibuf *)&pos,ibuf.rpos + -1000);
  _ok((uint)(ibuf.rpos == pcVar1),"ibuf.wpos == pos",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xc5,
      "line %d");
  sVar2 = ibuf_used((ibuf *)&pos);
  _ok((uint)(sVar2 == 1000),"ibuf_used(&ibuf) == 1000",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xc6,
      "line %d");
  ibuf_consume_before((ibuf *)&pos,ibuf.rpos);
  _ok((uint)(ibuf.rpos == pcVar1),"ibuf.wpos == pos",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",200,
      "line %d");
  sVar2 = ibuf_used((ibuf *)&pos);
  _ok((uint)(sVar2 == 0),"ibuf_used(&ibuf) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/ibuf.c",0xc9,
      "line %d");
  ibuf_destroy((ibuf *)&pos);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_ibuf_consume_before");
  check_plan();
  return;
}

Assistant:

static void
test_ibuf_consume_before(void)
{
	plan(4);
	header();

	struct ibuf ibuf;
	ibuf_create(&ibuf, &cache, 1024);
	ibuf_alloc(&ibuf, 5000);
	char *pos = ibuf.wpos;
	ibuf_consume_before(&ibuf, ibuf.wpos - 1000);
	ok(ibuf.wpos == pos);
	ok(ibuf_used(&ibuf) == 1000);
	ibuf_consume_before(&ibuf, ibuf.wpos);
	ok(ibuf.wpos == pos);
	ok(ibuf_used(&ibuf) == 0);
	ibuf_destroy(&ibuf);

	footer();
	check_plan();
}